

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

bool stringToInt(string *line,size_t start,size_t end,int64_t *result)

{
  int iVar1;
  char *pcVar2;
  int local_40;
  int32_t value;
  int c;
  int32_t base;
  int64_t *result_local;
  size_t end_local;
  size_t start_local;
  string *line_local;
  
  value = 10;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
  end_local = start;
  if (*pcVar2 == '0') {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
    iVar1 = tolower((int)*pcVar2);
    if (iVar1 == 0x78) {
      value = 0x10;
      end_local = start + 2;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
      iVar1 = tolower((int)*pcVar2);
      if (iVar1 == 0x6f) {
        value = 8;
        end_local = start + 2;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
        iVar1 = tolower((int)*pcVar2);
        if (iVar1 == 0x62) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
          iVar1 = tolower((int)*pcVar2);
          if (iVar1 != 0x68) {
            value = 2;
            end_local = start + 2;
          }
        }
      }
    }
  }
  result_local = (int64_t *)end;
  if (value == 10) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
    iVar1 = tolower((int)*pcVar2);
    if (iVar1 == 0x68) {
      value = 0x10;
      result_local = (int64_t *)(end - 1);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
      iVar1 = tolower((int)*pcVar2);
      if (iVar1 == 0x62) {
        value = 2;
        result_local = (int64_t *)(end - 1);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
        iVar1 = tolower((int)*pcVar2);
        if (iVar1 == 0x6f) {
          value = 8;
          result_local = (int64_t *)(end - 1);
        }
      }
    }
  }
  *result = 0;
  while( true ) {
    if (result_local <= end_local) {
      return true;
    }
    end_local = end_local + 1;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)line);
    local_40 = tolower((int)*pcVar2);
    if (local_40 < 0x61) {
      local_40 = local_40 + -0x30;
    }
    else {
      local_40 = local_40 + -0x57;
    }
    if (value <= local_40) break;
    *result = *result * (long)value + (long)local_40;
  }
  return false;
}

Assistant:

bool stringToInt(const std::string& line, size_t start, size_t end, int64_t& result)
{
	// find base of number
	int32_t base = 10;
	if (line[start] == '0')
	{
		if (tolower(line[start+1]) == 'x')
		{
			base = 16;
			start += 2;
		} else if (tolower(line[start+1]) == 'o')
		{
			base = 8;
			start += 2;
		} else if (tolower(line[start+1]) == 'b' && tolower(line[end-1]) != 'h')
		{
			base = 2;
			start += 2;
		}
	}

	if (base == 10)
	{
		if (tolower(line[end-1]) == 'h')
		{
			base = 16;
			end--;
		} else if (tolower(line[end-1]) == 'b')
		{
			base = 2;
			end--;
		} else if (tolower(line[end-1]) == 'o')
		{
			base = 8;
			end--;
		}
	}

	// convert number
	result = 0;
	while (start < end)
	{
		int c = tolower(line[start++]);

		int32_t value = c >= 'a' ? c-'a'+10 : c-'0';

		if (value >= base)
			return false;

		result = (result*base) + value;
	}

	return true;
}